

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# superGate.c
# Opt level: O2

int Super_CheckTimeout(ProgressBar *pPro,Super_Man_t *pMan)

{
  long lVar1;
  abctime aVar2;
  abctime aVar3;
  int nItemsCur;
  
  aVar2 = Abc_Clock();
  if (pMan->TimePrint < aVar2) {
    nItemsCur = pMan->TimeSec + 1;
    pMan->TimeSec = nItemsCur;
    if ((pPro == (ProgressBar *)0x0) || (pPro->nItemsNext <= nItemsCur)) {
      Extra_ProgressBarUpdate_int(pPro,nItemsCur,(char *)0x0);
    }
    aVar3 = Abc_Clock();
    pMan->TimePrint = aVar3 + 1000000;
  }
  lVar1 = pMan->TimeStop;
  if (aVar2 <= lVar1 || lVar1 == 0) {
    pMan->nTried = pMan->nTried + 1;
  }
  else {
    puts("Timeout!");
  }
  return (uint)(aVar2 > lVar1 && lVar1 != 0);
}

Assistant:

int Super_CheckTimeout( ProgressBar * pPro, Super_Man_t * pMan )
{
    abctime TimeNow = Abc_Clock();
    if ( TimeNow > pMan->TimePrint )
    {
        Extra_ProgressBarUpdate( pPro, ++pMan->TimeSec, NULL );
        pMan->TimePrint = Abc_Clock() + CLOCKS_PER_SEC;
    }
    if ( pMan->TimeStop && TimeNow > pMan->TimeStop )
    {
        printf ("Timeout!\n");
        return 1;
    }
    pMan->nTried++;
    return 0;
}